

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O3

void Hop_ObjDelete_rec(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *pHVar2;
  
  while( true ) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Hop_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                    ,0xd9,"void Hop_ObjDelete_rec(Hop_Man_t *, Hop_Obj_t *)");
    }
    if ((*(uint *)&pObj->field_0x20 & 7) - 1 < 2) {
      return;
    }
    if ((*(uint *)&pObj->field_0x20 & 6) != 4) {
      __assert_fail("Hop_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                    ,0xdc,"void Hop_ObjDelete_rec(Hop_Man_t *, Hop_Obj_t *)");
    }
    pHVar2 = pObj->pFanin0;
    pHVar1 = pObj->pFanin1;
    Hop_ObjDelete(p,pObj);
    pHVar2 = (Hop_Obj_t *)((ulong)pHVar2 & 0xfffffffffffffffe);
    if ((pHVar2 != (Hop_Obj_t *)0x0) &&
       (*(uint *)&pHVar2->field_0x20 < 0x40 && (*(uint *)&pHVar2->field_0x20 & 7) != 0)) {
      Hop_ObjDelete_rec(p,pHVar2);
    }
    pObj = (Hop_Obj_t *)((ulong)pHVar1 & 0xfffffffffffffffe);
    if (pObj == (Hop_Obj_t *)0x0) break;
    if (0x3f < *(uint *)&pObj->field_0x20) {
      return;
    }
    if ((*(uint *)&pObj->field_0x20 & 7) == 0) {
      return;
    }
  }
  return;
}

Assistant:

void Hop_ObjDelete_rec( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t * pFanin0, * pFanin1;
    assert( !Hop_IsComplement(pObj) );
    if ( Hop_ObjIsConst1(pObj) || Hop_ObjIsPi(pObj) )
        return;
    assert( Hop_ObjIsNode(pObj) );
    pFanin0 = Hop_ObjFanin0(pObj);
    pFanin1 = Hop_ObjFanin1(pObj);
    Hop_ObjDelete( p, pObj );
    if ( pFanin0 && !Hop_ObjIsNone(pFanin0) && Hop_ObjRefs(pFanin0) == 0 )
        Hop_ObjDelete_rec( p, pFanin0 );
    if ( pFanin1 && !Hop_ObjIsNone(pFanin1) && Hop_ObjRefs(pFanin1) == 0 )
        Hop_ObjDelete_rec( p, pFanin1 );
}